

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::JsonUnitTestResultPrinter::OutputJsonKey
               (ostream *stream,string *element_name,string *name,string *value,string *indent,
               bool comma)

{
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var1;
  ostream *poVar2;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  GetReservedOutputAttributesForElement(&local_48,element_name);
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,name);
  if (_Var1._M_current ==
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    GTestLog::GTestLog((GTestLog *)&local_68,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/3rdparty/googletest/googletest/src/gtest.cc"
                       ,0x11eb);
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "Condition std::find(allowed_names.begin(), allowed_names.end(), name) != allowed_names.end() failed. "
                            );
    poVar2 = std::operator<<(poVar2,"Key \"");
    poVar2 = std::operator<<(poVar2,(string *)name);
    poVar2 = std::operator<<(poVar2,"\" is not allowed for value \"");
    poVar2 = std::operator<<(poVar2,(string *)element_name);
    std::operator<<(poVar2,"\".");
    GTestLog::~GTestLog((GTestLog *)&local_68);
  }
  poVar2 = std::operator<<(stream,(string *)indent);
  poVar2 = std::operator<<(poVar2,"\"");
  poVar2 = std::operator<<(poVar2,(string *)name);
  poVar2 = std::operator<<(poVar2,"\": \"");
  EscapeJson(&local_68,value);
  poVar2 = std::operator<<(poVar2,(string *)&local_68);
  std::operator<<(poVar2,"\"");
  std::__cxx11::string::~string((string *)&local_68);
  if (comma) {
    std::operator<<(stream,",\n");
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonKey(
    std::ostream* stream,
    const std::string& element_name,
    const std::string& name,
    const std::string& value,
    const std::string& indent,
    bool comma) {
  const std::vector<std::string>& allowed_names =
      GetReservedOutputAttributesForElement(element_name);

  GTEST_CHECK_(std::find(allowed_names.begin(), allowed_names.end(), name) !=
                   allowed_names.end())
      << "Key \"" << name << "\" is not allowed for value \"" << element_name
      << "\".";

  *stream << indent << "\"" << name << "\": \"" << EscapeJson(value) << "\"";
  if (comma)
    *stream << ",\n";
}